

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

DLDataType __thiscall tvm::runtime::TVMArgValue::operator_cast_to_DLDataType(TVMArgValue *this)

{
  int *x;
  int iVar1;
  DLDataType DVar2;
  ostream *poVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  LogCheckError _check_err;
  LogCheckError local_1d0;
  string local_1c8;
  LogMessageFatal local_1a8;
  
  iVar1 = (this->super_TVMPODValue_).type_code_;
  if (iVar1 == 4) {
    DVar2.code = '\x03';
    DVar2.bits = '\0';
    DVar2.lanes = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  else if (iVar1 == 0xb) {
    operator_cast_to_string(&local_1c8,this);
    DVar2 = String2DLDataType(&local_1c8);
    uVar6 = (uint)DVar2 >> 8;
    uVar5 = (uint)DVar2 >> 0x10;
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    x = &(this->super_TVMPODValue_).type_code_;
    local_1a8.log_stream_ = (ostringstream)0x5;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_1d0,x,(anon_enum_32 *)&local_1a8);
    if (local_1d0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
                 ,0x237);
      poVar3 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"type_code_ == kTVMDataType");
      poVar3 = std::operator<<(poVar3,(string *)local_1d0.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3," expected ");
      poVar3 = std::operator<<(poVar3,"DLDataType");
      poVar3 = std::operator<<(poVar3," but get ");
      pcVar4 = TypeCode2Str(*x);
      std::operator<<(poVar3,pcVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1d0);
    DVar2.bits = '\0';
    DVar2.lanes = 0;
    DVar2.code = (this->super_TVMPODValue_).value_.v_type.code;
    uVar6 = (uint)(this->super_TVMPODValue_).value_.v_type.bits;
    uVar5 = (uint)(this->super_TVMPODValue_).value_.v_type.lanes;
  }
  return (DLDataType)((uint)DVar2 & 0xff | (uVar6 & 0xff) << 8 | uVar5 << 0x10);
}

Assistant:

operator DLDataType() const {
    if (type_code_ == kTVMStr) {
      return String2DLDataType(operator std::string());
    }
    // None type
    if (type_code_ == kTVMNullptr) {
      DLDataType t;
      t.code = kTVMOpaqueHandle; t.bits = 0; t.lanes = 0;
      return t;
    }
    TVM_CHECK_TYPE_CODE(type_code_, kTVMDataType);
    return value_.v_type;
  }